

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::PlaTask::checkArguments
          (PlaTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  ASTContext *pAVar2;
  reference ppEVar3;
  Args *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  SystemSubroutine *in_RDI;
  size_t in_R8;
  SystemSubroutine *in_R9;
  Type *elemType;
  Type *type;
  size_t i;
  Compilation *comp;
  Type *pTVar4;
  Type *this_01;
  Type *in_stack_ffffffffffffff58;
  Expression *in_stack_ffffffffffffff68;
  ASTContext *in_stack_ffffffffffffff70;
  Expression *in_stack_ffffffffffffff80;
  ASTContext *context_00;
  ASTContext *local_58;
  size_t in_stack_fffffffffffffff8;
  
  this_00 = ASTContext::getCompilation((ASTContext *)0x945741);
  pTVar4 = (Type *)0x3;
  this_01 = (Type *)0x3;
  callRange.endLoc = in_RSI;
  callRange.startLoc = in_RDX;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_R9,(ASTContext *)this_00,SUB81(in_R8 >> 0x38,0),in_RCX,callRange,in_R8,
                     in_stack_fffffffffffffff8);
  if (bVar1) {
    local_58 = (ASTContext *)0x0;
    while (context_00 = local_58,
          pAVar2 = (ASTContext *)
                   std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                             ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                              0x9457d2), context_00 < pAVar2) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,
                 (size_type)local_58);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x945801);
      if (local_58 == (ASTContext *)0x0) {
        bVar1 = Type::isUnpackedArray(pTVar4);
        if (!bVar1) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
          pTVar4 = SystemSubroutine::badArg(in_RDI,context_00,(Expression *)in_RSI);
          return pTVar4;
        }
        Type::getArrayElementType(in_stack_ffffffffffffff58);
        bVar1 = Type::isSimpleBitVector(in_stack_ffffffffffffff58);
        if ((!bVar1) || (bVar1 = Type::isPredefinedInteger((Type *)0x945887), bVar1)) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
          pTVar4 = SystemSubroutine::badArg(in_RDI,context_00,in_stack_ffffffffffffff80);
          return pTVar4;
        }
        bVar1 = Type::hasFixedRange(this_01);
        if (((bVar1) &&
            (ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
                       operator[]((span<const_slang::ast::Expression_*const,_18446744073709551615UL>
                                   *)in_RDX,0), (*ppEVar3)->kind != Concatenation)) &&
           (bVar1 = isValidRange(this_01), !bVar1)) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
          pTVar4 = badRange((ASTContext *)in_RSI,in_stack_ffffffffffffff68);
          return pTVar4;
        }
      }
      else {
        bVar1 = Type::isSimpleBitVector(in_stack_ffffffffffffff58);
        if ((!bVar1) || (bVar1 = Type::isPredefinedInteger((Type *)0x945958), bVar1)) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,
                     (size_type)local_58);
          pTVar4 = SystemSubroutine::badArg(in_RDI,context_00,in_stack_ffffffffffffff80);
          return pTVar4;
        }
      }
      bVar1 = Type::hasFixedRange(this_01);
      if (((bVar1) &&
          (ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
                     operator[]((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *
                                )in_RDX,(size_type)local_58), (*ppEVar3)->kind != Concatenation)) &&
         (bVar1 = isValidRange(this_01), !bVar1)) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                  ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,
                   (size_type)local_58);
        pTVar4 = badRange(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        return pTVar4;
      }
      local_58 = (ASTContext *)((long)&(local_58->scope).ptr + 1);
    }
    pTVar4 = Compilation::getVoidType(this_00);
  }
  else {
    pTVar4 = Compilation::getErrorType(this_00);
  }
  return pTVar4;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();

        if (!checkArgCount(context, false, args, range, 3, 3))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            auto& type = *args[i]->type;

            if (i == 0) {
                if (!type.isUnpackedArray()) {
                    return badArg(context, *args[i]);
                }

                auto& elemType = *type.getArrayElementType();
                if (!elemType.isSimpleBitVector() || elemType.isPredefinedInteger()) {
                    return badArg(context, *args[i]);
                }

                if (elemType.hasFixedRange() && args[i]->kind != ExpressionKind::Concatenation &&
                    !isValidRange(elemType)) {
                    return badRange(context, *args[i]);
                }
            }
            else {
                if (!type.isSimpleBitVector() || type.isPredefinedInteger()) {
                    return badArg(context, *args[i]);
                }
            }

            if (type.hasFixedRange() && args[i]->kind != ExpressionKind::Concatenation &&
                !isValidRange(type)) {
                return badRange(context, *args[i]);
            }
        }

        return comp.getVoidType();
    }